

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_server.cc
# Opt level: O0

bool bssl::add_new_session_tickets(SSL_HANDSHAKE *hs,bool *out_sent_tickets)

{
  byte bVar1;
  SSL *ssl_00;
  _func_bool_SSL_ptr_CBB_ptr_CBB_ptr_uint8_t *p_Var2;
  UniquePtr<SSL_SESSION> UVar3;
  bool bVar4;
  uint16_t value;
  uint32_t uVar5;
  int iVar6;
  pointer psVar7;
  pointer psVar8;
  pointer pSVar9;
  cbb_st *pcVar10;
  size_t sVar11;
  __uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true> _Var12;
  undefined1 in_R8B;
  Span<const_unsigned_char> nonce_00;
  byte local_1a5;
  SSLFlags local_18c;
  undefined1 local_188 [4];
  SSLFlags flags;
  CBB early_data;
  undefined8 local_150;
  undefined1 local_148 [8];
  CBB extensions;
  CBB ticket;
  CBB nonce_cbb;
  CBB body;
  ScopedCBB cbb;
  uint8_t nonce [1];
  bool enable_early_data;
  int local_44;
  unique_ptr<ssl_session_st,_bssl::internal::Deleter> local_40;
  UniquePtr<SSL_SESSION> session;
  size_t i;
  bool sent_tickets;
  SSL *ssl;
  bool *out_sent_tickets_local;
  SSL_HANDSHAKE *hs_local;
  
  ssl_00 = hs->ssl;
  if ((((*(uint *)&hs->field_0x6c8 >> 4 & 1) == 0) ||
      (uVar5 = SSL_get_options(ssl_00), (uVar5 & 0x4000) != 0)) ||
     (bVar4 = std::operator!=(&hs->pake_verifier,(nullptr_t)0x0), bVar4)) {
    *out_sent_tickets = false;
    hs_local._7_1_ = 1;
  }
  else {
    psVar7 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get(&hs->new_session);
    ssl_session_rebase_time(ssl_00,psVar7);
    psVar8 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::operator->(&ssl_00->session_ctx);
    if (0x10 < psVar8->num_tickets) {
      __assert_fail("ssl->session_ctx->num_tickets <= kMaxTickets",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                    ,0xaa,"bool bssl::add_new_session_tickets(SSL_HANDSHAKE *, bool *)");
    }
    i._7_1_ = false;
    for (session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl =
              (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)
              (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0;
        UVar3._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl =
             session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,
        psVar8 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::operator->
                           (&ssl_00->session_ctx),
        _Var12.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl._1_7_ = 0,
        _Var12.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl._0_1_ = psVar8->num_tickets,
        (ulong)UVar3._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl <
        (ulong)_Var12.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
        session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl =
             (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)
             ((long)session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t
                    .super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl + 1)) {
      psVar7 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get(&hs->new_session);
      SSL_SESSION_dup((bssl *)&local_40,psVar7,2);
      bVar4 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_40);
      if (bVar4) {
        psVar7 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_40);
        iVar6 = RAND_bytes((uchar *)&psVar7->ticket_age_add,4);
        if (iVar6 == 0) {
          hs_local._7_1_ = 0;
          local_44 = 1;
        }
        else {
          psVar7 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_40);
          psVar7->field_0x1b8 = psVar7->field_0x1b8 & 0xf7 | 8;
          local_1a5 = 0;
          if (((byte)ssl_00->field_0xa4 >> 2 & 1) != 0) {
            iVar6 = SSL_is_quic(ssl_00);
            if (iVar6 != 0) {
              pSVar9 = std::unique_ptr<bssl::SSL_CONFIG,_bssl::internal::Deleter>::operator->
                                 (&ssl_00->config);
              bVar4 = Array<unsigned_char>::empty(&pSVar9->quic_early_data_context);
              local_1a5 = 0;
              if (bVar4) goto LAB_001d8246;
            }
            iVar6 = SSL_is_dtls(ssl_00);
            local_1a5 = iVar6 != 0 ^ 0xff;
          }
LAB_001d8246:
          cbb.ctx_.u._27_1_ = local_1a5 & 1;
          if (cbb.ctx_.u._27_1_ != 0) {
            iVar6 = SSL_is_quic(ssl_00);
            uVar5 = 0x3800;
            if (iVar6 != 0) {
              uVar5 = 0xffffffff;
            }
            psVar7 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_40)
            ;
            psVar7->ticket_max_early_data = uVar5;
          }
          bVar1 = ssl_00->field_0xa4;
          psVar7 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_40);
          psVar7->field_0x1b8 = psVar7->field_0x1b8 & 0x7f | (bVar1 >> 3) << 7;
          if (0xff < (ulong)session._M_t.
                            super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl) {
            __assert_fail("i < 256",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                          ,0xc6,"bool bssl::add_new_session_tickets(SSL_HANDSHAKE *, bool *)");
          }
          cbb.ctx_.u._26_1_ =
               session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl._0_1_;
          internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::StackAllocated
                    ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)((long)&body.u + 0x18)
                    );
          p_Var2 = ssl_00->method->init_message;
          pcVar10 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                              ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                               ((long)&body.u + 0x18));
          bVar4 = (*p_Var2)(ssl_00,pcVar10,(CBB *)((long)&nonce_cbb.u + 0x18),'\x04');
          if (bVar4) {
            psVar7 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_40)
            ;
            iVar6 = CBB_add_u32((CBB *)((long)&nonce_cbb.u + 0x18),psVar7->timeout);
            if (iVar6 == 0) goto LAB_001d84f6;
            psVar7 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_40)
            ;
            iVar6 = CBB_add_u32((CBB *)((long)&nonce_cbb.u + 0x18),psVar7->ticket_age_add);
            if (((iVar6 == 0) ||
                (iVar6 = CBB_add_u8_length_prefixed
                                   ((CBB *)((long)&nonce_cbb.u + 0x18),
                                    (CBB *)((long)&ticket.u + 0x18)), iVar6 == 0)) ||
               (iVar6 = CBB_add_bytes((CBB *)((long)&ticket.u + 0x18),
                                      (uint8_t *)((long)&cbb.ctx_.u + 0x1a),1), iVar6 == 0))
            goto LAB_001d84f6;
            psVar7 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get(&local_40);
            Span<unsigned_char_const>::Span<1ul>
                      ((Span<unsigned_char_const> *)((long)&early_data.u + 0x18),
                       (uchar (*) [1])((long)&cbb.ctx_.u + 0x1a));
            iVar6 = SSL_is_dtls(ssl_00);
            nonce_00.size_._0_1_ = iVar6 != 0;
            nonce_00.data_ = (uchar *)local_150;
            nonce_00.size_._1_7_ = 0;
            bVar4 = tls13_derive_session_psk
                              ((bssl *)psVar7,(SSL_SESSION *)early_data.u._24_8_,nonce_00,
                               (bool)in_R8B);
            if ((!bVar4) ||
               (iVar6 = CBB_add_u16_length_prefixed
                                  ((CBB *)((long)&nonce_cbb.u + 0x18),
                                   (CBB *)((long)&extensions.u + 0x18)), iVar6 == 0))
            goto LAB_001d84f6;
            psVar7 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get(&local_40);
            bVar4 = ssl_encrypt_ticket(hs,(CBB *)((long)&extensions.u + 0x18),psVar7);
            if (!bVar4) goto LAB_001d84f6;
            sVar11 = CBB_len((CBB *)((long)&extensions.u + 0x18));
            if (sVar11 == 0) {
              local_44 = 4;
            }
            else {
              iVar6 = CBB_add_u16_length_prefixed
                                ((CBB *)((long)&nonce_cbb.u + 0x18),(CBB *)local_148);
              if (iVar6 == 0) {
                hs_local._7_1_ = 0;
                local_44 = 1;
              }
              else if ((cbb.ctx_.u._27_1_ & 1) == 0) {
LAB_001d8637:
                local_18c = 0;
                psVar7 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->
                                   (&local_40);
                if ((char)psVar7->field_0x1b8 < '\0') {
                  local_18c = 0x100;
                }
                bVar4 = ssl_add_flags_extension((CBB *)local_148,local_18c);
                if (bVar4) {
                  value = ssl_get_grease_value(hs,ssl_grease_ticket_extension);
                  iVar6 = CBB_add_u16((CBB *)local_148,value);
                  if ((iVar6 == 0) || (iVar6 = CBB_add_u16((CBB *)local_148,0), iVar6 == 0)) {
                    hs_local._7_1_ = 0;
                    local_44 = 1;
                  }
                  else {
                    pcVar10 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                                        ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                                         ((long)&body.u + 0x18));
                    bVar4 = ssl_add_message_cbb(ssl_00,pcVar10);
                    if (bVar4) {
                      i._7_1_ = true;
                      local_44 = 0;
                    }
                    else {
                      hs_local._7_1_ = 0;
                      local_44 = 1;
                    }
                  }
                }
                else {
                  hs_local._7_1_ = 0;
                  local_44 = 1;
                }
              }
              else {
                iVar6 = CBB_add_u16((CBB *)local_148,0x2a);
                if ((iVar6 != 0) &&
                   (iVar6 = CBB_add_u16_length_prefixed((CBB *)local_148,(CBB *)local_188),
                   iVar6 != 0)) {
                  psVar7 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->
                                     (&local_40);
                  iVar6 = CBB_add_u32((CBB *)local_188,psVar7->ticket_max_early_data);
                  if ((iVar6 != 0) && (iVar6 = CBB_flush((CBB *)local_148), iVar6 != 0))
                  goto LAB_001d8637;
                }
                hs_local._7_1_ = 0;
                local_44 = 1;
              }
            }
          }
          else {
LAB_001d84f6:
            hs_local._7_1_ = 0;
            local_44 = 1;
          }
          internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
                    ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)((long)&body.u + 0x18)
                    );
        }
      }
      else {
        hs_local._7_1_ = 0;
        local_44 = 1;
      }
      std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr(&local_40);
      if ((local_44 != 0) && (local_44 == 1)) goto LAB_001d87b9;
    }
    *out_sent_tickets = i._7_1_;
    hs_local._7_1_ = 1;
  }
LAB_001d87b9:
  return (bool)(hs_local._7_1_ & 1);
}

Assistant:

static bool add_new_session_tickets(SSL_HANDSHAKE *hs, bool *out_sent_tickets) {
  SSL *const ssl = hs->ssl;
  if (  // If the client doesn't accept resumption with PSK_DHE_KE, don't send a
        // session ticket.
      !hs->accept_psk_mode ||
      // We only implement stateless resumption in TLS 1.3, so skip sending
      // tickets if disabled.
      (SSL_get_options(ssl) & SSL_OP_NO_TICKET) ||
      // Don't send tickets for PAKE connections. We don't support resumption
      // with PAKEs.
      hs->pake_verifier != nullptr) {
    *out_sent_tickets = false;
    return true;
  }

  // Rebase the session timestamp so that it is measured from ticket
  // issuance.
  ssl_session_rebase_time(ssl, hs->new_session.get());

  assert(ssl->session_ctx->num_tickets <= kMaxTickets);
  bool sent_tickets = false;
  for (size_t i = 0; i < ssl->session_ctx->num_tickets; i++) {
    UniquePtr<SSL_SESSION> session(
        SSL_SESSION_dup(hs->new_session.get(), SSL_SESSION_INCLUDE_NONAUTH));
    if (!session) {
      return false;
    }

    if (!RAND_bytes((uint8_t *)&session->ticket_age_add, 4)) {
      return false;
    }
    session->ticket_age_add_valid = true;
    // TODO(crbug.com/381113363): Remove the SSL_is_dtls check once we support
    // 0-RTT for DTLS 1.3.
    bool enable_early_data =
        ssl->enable_early_data &&
        (!SSL_is_quic(ssl) || !ssl->config->quic_early_data_context.empty()) &&
        !SSL_is_dtls(ssl);
    if (enable_early_data) {
      // QUIC does not use the max_early_data_size parameter and always sets it
      // to a fixed value. See RFC 9001, section 4.6.1.
      session->ticket_max_early_data =
          SSL_is_quic(ssl) ? 0xffffffff : kMaxEarlyDataAccepted;
    }
    session->is_resumable_across_names = ssl->resumption_across_names_enabled;

    static_assert(kMaxTickets < 256, "Too many tickets");
    assert(i < 256);
    uint8_t nonce[] = {static_cast<uint8_t>(i)};

    ScopedCBB cbb;
    CBB body, nonce_cbb, ticket, extensions;
    if (!ssl->method->init_message(ssl, cbb.get(), &body,
                                   SSL3_MT_NEW_SESSION_TICKET) ||
        !CBB_add_u32(&body, session->timeout) ||
        !CBB_add_u32(&body, session->ticket_age_add) ||
        !CBB_add_u8_length_prefixed(&body, &nonce_cbb) ||
        !CBB_add_bytes(&nonce_cbb, nonce, sizeof(nonce)) ||
        !tls13_derive_session_psk(session.get(), nonce, SSL_is_dtls(ssl)) ||
        !CBB_add_u16_length_prefixed(&body, &ticket) ||
        !ssl_encrypt_ticket(hs, &ticket, session.get())) {
      return false;
    }

    if (CBB_len(&ticket) == 0) {
      // The caller decided not to encrypt a ticket. Skip the message.
      continue;
    }

    if (!CBB_add_u16_length_prefixed(&body, &extensions)) {
      return false;
    }

    if (enable_early_data) {
      CBB early_data;
      if (!CBB_add_u16(&extensions, TLSEXT_TYPE_early_data) ||
          !CBB_add_u16_length_prefixed(&extensions, &early_data) ||
          !CBB_add_u32(&early_data, session->ticket_max_early_data) ||
          !CBB_flush(&extensions)) {
        return false;
      }
    }

    SSLFlags flags = 0;
    if (session->is_resumable_across_names) {
      flags |= kSSLFlagResumptionAcrossNames;
    }
    if (!ssl_add_flags_extension(&extensions, flags)) {
      return false;
    }

    // Add a fake extension. See RFC 8701.
    if (!CBB_add_u16(&extensions,
                     ssl_get_grease_value(hs, ssl_grease_ticket_extension)) ||
        !CBB_add_u16(&extensions, 0 /* empty */)) {
      return false;
    }

    if (!ssl_add_message_cbb(ssl, cbb.get())) {
      return false;
    }
    sent_tickets = true;
  }

  *out_sent_tickets = sent_tickets;
  return true;
}